

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

assetsys_error_t assetsys_dismount(assetsys_t *sys,char *path,char *mounted_as)

{
  int iVar1;
  size_t sVar2;
  unsigned_long_long handle;
  unsigned_long_long handle_00;
  assetsys_internal_mount_t *paVar3;
  int local_54;
  int count;
  int j_1;
  int j;
  mz_bool result;
  assetsys_internal_mount_t *mount;
  int i;
  unsigned_long_long mount_handle;
  unsigned_long_long path_handle;
  char *mounted_as_local;
  char *path_local;
  assetsys_t *sys_local;
  
  if (path == (char *)0x0) {
    sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PARAMETER;
  }
  else if (mounted_as == (char *)0x0) {
    sys_local._4_4_ = ASSETSYS_ERROR_INVALID_MOUNT;
  }
  else {
    sVar2 = strlen(path);
    handle = strpool_inject(&sys->strpool,path,(int)sVar2);
    sVar2 = strlen(mounted_as);
    handle_00 = strpool_inject(&sys->strpool,mounted_as,(int)sVar2);
    for (mount._4_4_ = 0; mount._4_4_ < sys->mounts_count; mount._4_4_ = mount._4_4_ + 1) {
      paVar3 = sys->mounts + mount._4_4_;
      if ((paVar3->mounted_as == handle_00) && (paVar3->path == handle)) {
        j_1 = 1;
        if (paVar3->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP) {
          j_1 = mz_zip_reader_end(&paVar3->zip);
        }
        strpool_decref(&sys->strpool,paVar3->mounted_as);
        strpool_decref(&sys->strpool,paVar3->path);
        strpool_discard(&sys->strpool,handle_00);
        strpool_discard(&sys->strpool,handle);
        for (count = 0; count < paVar3->dirs_count; count = count + 1) {
          assetsys_internal_remove_collated(sys,paVar3->dirs[count].collated_index);
        }
        for (local_54 = 0; local_54 < paVar3->files_count; local_54 = local_54 + 1) {
          assetsys_internal_remove_collated(sys,paVar3->files[local_54].collated_index);
        }
        free(paVar3->dirs);
        free(paVar3->files);
        iVar1 = sys->mounts_count - mount._4_4_;
        if (0 < iVar1) {
          memcpy(sys->mounts + mount._4_4_,sys->mounts + (mount._4_4_ + 1),(long)iVar1 * 0x98);
        }
        sys->mounts_count = sys->mounts_count + -1;
        if (j_1 != 0) {
          return ASSETSYS_SUCCESS;
        }
        return ASSETSYS_ERROR_FAILED_TO_CLOSE_ZIP;
      }
    }
    strpool_discard(&sys->strpool,handle_00);
    strpool_discard(&sys->strpool,handle);
    sys_local._4_4_ = ASSETSYS_ERROR_INVALID_MOUNT;
  }
  return sys_local._4_4_;
}

Assistant:

assetsys_error_t assetsys_dismount( assetsys_t* sys, char const* path, char const* mounted_as )
    {
    if( !path ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( !mounted_as ) return ASSETSYS_ERROR_INVALID_MOUNT;

    ASSETSYS_U64 path_handle = strpool_inject( &sys->strpool, path, (int) strlen( path ) );
    ASSETSYS_U64 mount_handle = strpool_inject( &sys->strpool, mounted_as, (int) strlen( mounted_as ) );

    for( int i = 0; i < sys->mounts_count; ++i )
        {
        struct assetsys_internal_mount_t* mount = &sys->mounts[ i ];
        if( mount->mounted_as == mount_handle && mount->path == path_handle )
            {
            mz_bool result = 1;
            if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP ) result = mz_zip_reader_end( &mount->zip );

            strpool_decref( &sys->strpool, mount->mounted_as );
            strpool_decref( &sys->strpool, mount->path );
            strpool_discard( &sys->strpool, mount_handle );
            strpool_discard( &sys->strpool, path_handle );
            
            for( int j = 0; j < mount->dirs_count; ++j )
                assetsys_internal_remove_collated( sys, mount->dirs[ j ].collated_index );

            for( int j = 0; j < mount->files_count; ++j )
                assetsys_internal_remove_collated( sys, mount->files[ j ].collated_index );

            ASSETSYS_FREE( sys->memctx, mount->dirs );
            ASSETSYS_FREE( sys->memctx, mount->files );

            int count = sys->mounts_count - i;
            if( count > 0 ) memcpy( &sys->mounts[ i ], &sys->mounts[ i + 1 ], sizeof( *sys->mounts ) * count );
            --sys->mounts_count;

            return !result ? ASSETSYS_ERROR_FAILED_TO_CLOSE_ZIP : ASSETSYS_SUCCESS;
            }
        }

    strpool_discard( &sys->strpool, mount_handle );
    strpool_discard( &sys->strpool, path_handle );
    return ASSETSYS_ERROR_INVALID_MOUNT;
    }